

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.h
# Opt level: O3

void __thiscall
Js::
SynchronizableList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_JsUtil::List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_Js::DefaultContainerLockPolicy,_CriticalSection>
::~SynchronizableList
          (SynchronizableList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_JsUtil::List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_Js::DefaultContainerLockPolicy,_CriticalSection>
           *this)

{
  (this->
  super_List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  ).
  super_ReadOnlyList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_DefaultComparer>
  ._vptr_ReadOnlyList = (_func_int **)&PTR_IsReadOnly_014db108;
  JsUtil::
  List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  ::Reset(&this->
           super_List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
         );
  operator_delete(this);
  return;
}

Assistant:

class SynchronizableList sealed: private ListType // Make base class private to lock down exposed methods
    {
    private:
        FieldNoBarrier(SyncObject*) syncObj;

    public:
        template <class Arg1>
        SynchronizableList(Arg1 arg1, SyncObject* syncObj)
            : ListType(arg1), syncObj(syncObj)
        {
        }

        template <class Arg1, class Arg2>
        SynchronizableList(Arg1 arg1, Arg2 arg2, SyncObject* syncObj)
            : ListType(arg1, arg2), syncObj(syncObj)
        {
        }

        template <class Arg1, class Arg2, class Arg3>
        SynchronizableList(Arg1 arg1, Arg2 arg2, Arg3 arg3, SyncObject* syncObj)
            : ListType(arg1, arg2, arg3), syncObj(syncObj)
        {
        }

        int Count() const
        {
            typename LockPolicy::ReadLock autoLock(syncObj);
            return __super::Count();
        }

        const T& Item(int index) const
        {
            typename LockPolicy::ReadLock autoLock(syncObj);
            return __super::Item(index);
        }

        void Item(int index, const T& item)
        {
            typename LockPolicy::WriteLock autoLock(syncObj);
            __super::Item(index, item);
        }

        void SetExistingItem(int index, const T& item)
        {
            typename LockPolicy::WriteLock autoLock(syncObj);
            __super::SetExistingItem(index, item);
        }

        bool IsItemValid(int index)
        {
            typename LockPolicy::ReadLock autoLock(syncObj);
            return __super::IsItemValid(index);
        }

        int SetAtFirstFreeSpot(const T& item)
        {
            typename LockPolicy::WriteLock autoLock(syncObj);
            return __super::SetAtFirstFreeSpot(item);
        }

        void ClearAndZero()
        {
            typename LockPolicy::WriteLock autoLock(syncObj);
            __super::ClearAndZero();
        }

        void RemoveAt(int index)
        {
            typename LockPolicy::AddRemoveLock autoLock(syncObj);
            return __super::RemoveAt(index);
        }

        int Add(const T& item)
        {
            typename LockPolicy::AddRemoveLock autoLock(syncObj);
            return __super::Add(item);
        }

        template<class TMapFunction>
        void Map(TMapFunction map) const
        {
            typename LockPolicy::ReadLock autoLock(syncObj);
            __super::Map(map);
        }

        template<class TMapFunction>
        bool MapUntil(TMapFunction map) const
        {
            typename LockPolicy::ReadLock autoLock(syncObj);
            return __super::MapUntil(map);
        }

        template<class DebugSite, class TMapFunction>
        HRESULT Map(DebugSite site, TMapFunction map) const // external debugging version
        {
            // No lock needed. Threads are suspended during external debugging.
            return __super::Map(site, map);
        }
    }